

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<Object_Nested_Test<char>_>::CreateTest
          (TestFactoryImpl<Object_Nested_Test<char>_> *this)

{
  Test *this_00;
  TestFactoryImpl<Object_Nested_Test<char>_> *this_local;
  
  this_00 = (Test *)operator_new(0x188);
  Object_Nested_Test<char>::Object_Nested_Test((Object_Nested_Test<char> *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }